

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

int run_test_fs_readdir_non_existing_dir(void)

{
  char *__s1;
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_fs_t *puVar2;
  undefined8 uVar3;
  uv_fs_t *puVar4;
  long lVar5;
  undefined1 auStack_8f8 [440];
  uv_fs_t *puStack_740;
  undefined1 auStack_730 [440];
  uv_fs_t uStack_578;
  undefined1 auStack_3c0 [440];
  undefined1 auStack_208 [440];
  uv_fs_t *puStack_50;
  
  memset(&opendir_req,0xdb,0x1b8);
  puVar2 = (uv_fs_t *)uv_default_loop();
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"./non-existing-dir/",0);
  if (iVar1 == -2) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a7c1;
    if (opendir_req.result != -2) goto LAB_0015a7c6;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0015a7cb;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1b8);
    puVar2 = (uv_fs_t *)uv_default_loop();
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"./non-existing-dir/",non_existing_opendir_cb);
    if (iVar1 != 0) goto LAB_0015a7d0;
    if (non_existing_opendir_cb_count != 0) goto LAB_0015a7d5;
    puVar2 = (uv_fs_t *)uv_default_loop();
    iVar1 = uv_run(puVar2,0);
    if (iVar1 != 0) goto LAB_0015a7da;
    if (non_existing_opendir_cb_count != 1) goto LAB_0015a7df;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    puVar2 = (uv_fs_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_readdir_non_existing_dir_cold_1();
LAB_0015a7c1:
    run_test_fs_readdir_non_existing_dir_cold_2();
LAB_0015a7c6:
    run_test_fs_readdir_non_existing_dir_cold_3();
LAB_0015a7cb:
    run_test_fs_readdir_non_existing_dir_cold_4();
LAB_0015a7d0:
    run_test_fs_readdir_non_existing_dir_cold_5();
LAB_0015a7d5:
    run_test_fs_readdir_non_existing_dir_cold_6();
LAB_0015a7da:
    run_test_fs_readdir_non_existing_dir_cold_7();
LAB_0015a7df:
    run_test_fs_readdir_non_existing_dir_cold_8();
  }
  run_test_fs_readdir_non_existing_dir_cold_9();
  if (puVar2 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a82c;
    if (opendir_req.result != -2) goto LAB_0015a831;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
      return extraout_EAX;
    }
  }
  else {
    non_existing_opendir_cb_cold_1();
LAB_0015a82c:
    non_existing_opendir_cb_cold_2();
LAB_0015a831:
    non_existing_opendir_cb_cold_3();
  }
  non_existing_opendir_cb_cold_4();
  memset(&opendir_req,0xdb,0x1b8);
  puVar2 = (uv_fs_t *)uv_default_loop();
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test/fixtures/empty_file",0);
  if (iVar1 == -0x14) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a945;
    if (opendir_req.result != -0x14) goto LAB_0015a94a;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0015a94f;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1b8);
    puVar2 = (uv_fs_t *)uv_default_loop();
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
    if (iVar1 != 0) goto LAB_0015a954;
    if (file_opendir_cb_count != 0) goto LAB_0015a959;
    puVar2 = (uv_fs_t *)uv_default_loop();
    iVar1 = uv_run(puVar2,0);
    if (iVar1 != 0) goto LAB_0015a95e;
    if (file_opendir_cb_count != 1) goto LAB_0015a963;
    puVar4 = (uv_fs_t *)uv_default_loop();
    uv_walk(puVar4,close_walk_cb,0);
    uv_run(puVar4,0);
    puVar2 = (uv_fs_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_readdir_file_cold_1();
LAB_0015a945:
    run_test_fs_readdir_file_cold_2();
LAB_0015a94a:
    run_test_fs_readdir_file_cold_3();
LAB_0015a94f:
    run_test_fs_readdir_file_cold_4();
LAB_0015a954:
    run_test_fs_readdir_file_cold_5();
LAB_0015a959:
    run_test_fs_readdir_file_cold_6();
LAB_0015a95e:
    run_test_fs_readdir_file_cold_7();
LAB_0015a963:
    puVar4 = &opendir_req;
    run_test_fs_readdir_file_cold_8();
  }
  run_test_fs_readdir_file_cold_9();
  if (puVar2 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a9b0;
    if (opendir_req.result != -0x14) goto LAB_0015a9b5;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return extraout_EAX_00;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_0015a9b0:
    file_opendir_cb_cold_2();
LAB_0015a9b5:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_740 = (uv_fs_t *)0x15a9d5;
  puStack_50 = puVar4;
  cleanup_test_files();
  puStack_740 = (uv_fs_t *)0x15a9da;
  uVar3 = uv_default_loop();
  puStack_740 = (uv_fs_t *)0x15a9f9;
  iVar1 = uv_fs_mkdir(uVar3,auStack_3c0,"test_dir",0x1ed,0);
  if (iVar1 == 0) {
    puStack_740 = (uv_fs_t *)0x15aa06;
    uVar3 = uv_default_loop();
    puStack_740 = (uv_fs_t *)0x15aa2b;
    iVar1 = uv_fs_open(uVar3,&uStack_578,"test_dir/file1",0x41,0x180,0);
    puVar2 = puVar4;
    if (iVar1 < 0) goto LAB_0015add1;
    puVar2 = &uStack_578;
    puStack_740 = (uv_fs_t *)0x15aa43;
    uv_fs_req_cleanup(puVar2);
    puStack_740 = (uv_fs_t *)0x15aa48;
    uVar3 = uv_default_loop();
    puStack_740 = (uv_fs_t *)0x15aa5a;
    iVar1 = uv_fs_close(uVar3,auStack_730,(undefined4)uStack_578.result,0);
    if (iVar1 != 0) goto LAB_0015add6;
    puStack_740 = (uv_fs_t *)0x15aa6c;
    uv_fs_req_cleanup(auStack_730);
    puStack_740 = (uv_fs_t *)0x15aa71;
    uVar3 = uv_default_loop();
    puStack_740 = (uv_fs_t *)0x15aa96;
    iVar1 = uv_fs_open(uVar3,&uStack_578,"test_dir/file2",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_0015addb;
    puVar2 = &uStack_578;
    puStack_740 = (uv_fs_t *)0x15aaae;
    uv_fs_req_cleanup(puVar2);
    puStack_740 = (uv_fs_t *)0x15aab3;
    uVar3 = uv_default_loop();
    puStack_740 = (uv_fs_t *)0x15aac5;
    iVar1 = uv_fs_close(uVar3,auStack_730,(undefined4)uStack_578.result,0);
    if (iVar1 != 0) goto LAB_0015ade0;
    puStack_740 = (uv_fs_t *)0x15aad7;
    uv_fs_req_cleanup(auStack_730);
    puStack_740 = (uv_fs_t *)0x15aadc;
    uVar3 = uv_default_loop();
    puStack_740 = (uv_fs_t *)0x15aafb;
    iVar1 = uv_fs_mkdir(uVar3,auStack_3c0,"test_dir/test_subdir",0x1ed,0);
    if (iVar1 != 0) goto LAB_0015ade5;
    puStack_740 = (uv_fs_t *)0x15ab10;
    uv_fs_req_cleanup(auStack_3c0);
    puVar2 = &opendir_req;
    puStack_740 = (uv_fs_t *)0x15ab29;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_740 = (uv_fs_t *)0x15ab2e;
    uVar3 = uv_default_loop();
    puStack_740 = (uv_fs_t *)0x15ab42;
    iVar1 = uv_fs_opendir(uVar3,&opendir_req,"test_dir",0);
    puVar4 = (uv_fs_t *)opendir_req.ptr;
    if (iVar1 != 0) goto LAB_0015adea;
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015adef;
    if (opendir_req.result != 0) goto LAB_0015adf4;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0015adf9;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)puVar4 + 8) = 1;
    puStack_740 = (uv_fs_t *)0x15ab93;
    uv_fs_req_cleanup(&opendir_req);
    puStack_740 = (uv_fs_t *)0x15ab98;
    uVar3 = uv_default_loop();
    puStack_740 = (uv_fs_t *)0x15abac;
    iVar1 = uv_fs_readdir(uVar3,&readdir_req,puVar4,0);
    if (iVar1 == 0) {
LAB_0015adc7:
      puStack_740 = (uv_fs_t *)0x15adcc;
      run_test_fs_readdir_non_empty_dir_cold_21();
      goto LAB_0015adcc;
    }
    lVar5 = 3;
    do {
      __s1 = dirents[0].name;
      puStack_740 = (uv_fs_t *)0x15abe1;
      iVar1 = strcmp(dirents[0].name,"file1");
      if (iVar1 != 0) {
        puStack_740 = (uv_fs_t *)0x15abf4;
        iVar1 = strcmp(__s1,"file2");
        if (iVar1 == 0) goto LAB_0015ac0b;
        puStack_740 = (uv_fs_t *)0x15ac03;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) goto LAB_0015ac0b;
LAB_0015adbd:
        puStack_740 = (uv_fs_t *)0x15adc2;
        run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0015adc2:
        puStack_740 = (uv_fs_t *)0x15adc7;
        run_test_fs_readdir_non_empty_dir_cold_12();
        goto LAB_0015adc7;
      }
LAB_0015ac0b:
      puStack_740 = (uv_fs_t *)0x15ac16;
      iVar1 = strcmp(__s1,"test_subdir");
      if (iVar1 == 0) {
        if (dirents[0].type == UV_DIRENT_DIR) goto LAB_0015ac33;
        goto LAB_0015adc2;
      }
      if (dirents[0].type != UV_DIRENT_FILE) {
        puStack_740 = (uv_fs_t *)0x15adbd;
        run_test_fs_readdir_non_empty_dir_cold_11();
        goto LAB_0015adbd;
      }
LAB_0015ac33:
      puStack_740 = (uv_fs_t *)0x15ac3b;
      uv_fs_req_cleanup(&readdir_req);
      puStack_740 = (uv_fs_t *)0x15ac40;
      uVar3 = uv_default_loop();
      puStack_740 = (uv_fs_t *)0x15ac50;
      iVar1 = uv_fs_readdir(uVar3,&readdir_req,puVar4,0);
      lVar5 = lVar5 + -1;
    } while (iVar1 != 0);
    if (lVar5 != 0) goto LAB_0015adc7;
    puStack_740 = (uv_fs_t *)0x15ac70;
    uv_fs_req_cleanup(&readdir_req);
    puStack_740 = (uv_fs_t *)0x15ac89;
    memset(&closedir_req,0xdb,0x1b8);
    puStack_740 = (uv_fs_t *)0x15ac8e;
    uVar3 = uv_default_loop();
    puStack_740 = (uv_fs_t *)0x15ac9e;
    uv_fs_closedir(uVar3,&closedir_req,puVar4,0);
    if (closedir_req.result != 0) goto LAB_0015adfe;
    puStack_740 = (uv_fs_t *)0x15acb8;
    uv_fs_req_cleanup(&closedir_req);
    puVar4 = &opendir_req;
    puStack_740 = (uv_fs_t *)0x15acd1;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_740 = (uv_fs_t *)0x15acd6;
    uVar3 = uv_default_loop();
    puStack_740 = (uv_fs_t *)0x15acef;
    iVar1 = uv_fs_opendir(uVar3,&opendir_req,"test_dir",non_empty_opendir_cb);
    if (iVar1 != 0) goto LAB_0015ae03;
    if (non_empty_opendir_cb_count != 0) goto LAB_0015ae08;
    if (non_empty_closedir_cb_count != 0) goto LAB_0015ae0d;
    puStack_740 = (uv_fs_t *)0x15ad16;
    uVar3 = uv_default_loop();
    puStack_740 = (uv_fs_t *)0x15ad20;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0015ae12;
    if (non_empty_opendir_cb_count != 1) goto LAB_0015ae17;
    if (non_empty_closedir_cb_count == 1) {
      puStack_740 = (uv_fs_t *)0x15ad47;
      uVar3 = uv_default_loop();
      puStack_740 = (uv_fs_t *)0x15ad63;
      uv_fs_rmdir(uVar3,auStack_208,"test_subdir",0);
      puStack_740 = (uv_fs_t *)0x15ad6b;
      uv_fs_req_cleanup(auStack_208);
      puStack_740 = (uv_fs_t *)0x15ad70;
      cleanup_test_files();
      puStack_740 = (uv_fs_t *)0x15ad75;
      puVar4 = (uv_fs_t *)uv_default_loop();
      puStack_740 = (uv_fs_t *)0x15ad89;
      uv_walk(puVar4,close_walk_cb,0);
      puStack_740 = (uv_fs_t *)0x15ad93;
      uv_run(puVar4,0);
      puStack_740 = (uv_fs_t *)0x15ad98;
      uVar3 = uv_default_loop();
      puStack_740 = (uv_fs_t *)0x15ada0;
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015ae21;
    }
  }
  else {
LAB_0015adcc:
    puStack_740 = (uv_fs_t *)0x15add1;
    run_test_fs_readdir_non_empty_dir_cold_1();
    puVar2 = puVar4;
LAB_0015add1:
    puStack_740 = (uv_fs_t *)0x15add6;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0015add6:
    puStack_740 = (uv_fs_t *)0x15addb;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0015addb:
    puStack_740 = (uv_fs_t *)0x15ade0;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0015ade0:
    puStack_740 = (uv_fs_t *)0x15ade5;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0015ade5:
    puStack_740 = (uv_fs_t *)0x15adea;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0015adea:
    puStack_740 = (uv_fs_t *)0x15adef;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0015adef:
    puStack_740 = (uv_fs_t *)0x15adf4;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0015adf4:
    puVar4 = puVar2;
    puStack_740 = (uv_fs_t *)0x15adf9;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0015adf9:
    puStack_740 = (uv_fs_t *)0x15adfe;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0015adfe:
    puStack_740 = (uv_fs_t *)0x15ae03;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0015ae03:
    puStack_740 = (uv_fs_t *)0x15ae08;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0015ae08:
    puStack_740 = (uv_fs_t *)0x15ae0d;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0015ae0d:
    puStack_740 = (uv_fs_t *)0x15ae12;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0015ae12:
    puStack_740 = (uv_fs_t *)0x15ae17;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0015ae17:
    puStack_740 = (uv_fs_t *)0x15ae1c;
    run_test_fs_readdir_non_empty_dir_cold_18();
  }
  puStack_740 = (uv_fs_t *)0x15ae21;
  run_test_fs_readdir_non_empty_dir_cold_19();
LAB_0015ae21:
  puStack_740 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_20();
  puStack_740 = puVar4;
  uv_fs_unlink(0,auStack_8f8,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_8f8);
  uv_fs_unlink(0,auStack_8f8,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_8f8);
  uv_fs_rmdir(0,auStack_8f8,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_8f8);
  uv_fs_rmdir(0,auStack_8f8,"test_dir",0);
  iVar1 = uv_fs_req_cleanup(auStack_8f8);
  return iVar1;
}

Assistant:

TEST_IMPL(fs_readdir_non_existing_dir) {
  const char* path;
  int r;

  path = "./non-existing-dir/";

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, NULL);
  ASSERT(r == UV_ENOENT);
  ASSERT(opendir_req.fs_type == UV_FS_OPENDIR);
  ASSERT(opendir_req.result == UV_ENOENT);
  ASSERT(opendir_req.ptr == NULL);
  uv_fs_req_cleanup(&opendir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the async flavor. */
  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    path,
                    non_existing_opendir_cb);
  ASSERT(r == 0);
  ASSERT(non_existing_opendir_cb_count == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(non_existing_opendir_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}